

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

vec3 * __thiscall Sphere::intersect(Sphere *this,shared_ptr<Ray> *ray)

{
  float fVar1;
  float fVar2;
  float fVar3;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  left;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  left_00;
  anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
  right;
  vec4 *pvVar4;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *paVar5;
  vec3 *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  vec4 left_01;
  vec4 right_00;
  vec4 right_01;
  
  pvVar4 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  fVar10 = (pvVar4->field_0).field_0.x;
  fVar14 = (pvVar4->field_0).field_0.y;
  fVar1 = (pvVar4->field_0).field_0.z;
  fVar15 = (pvVar4->field_0).field_0.w;
  paVar5 = &Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            field_0;
  right = paVar5->field_0;
  left_00 = paVar5->field_0;
  left = paVar5->field_0;
  fVar9 = (paVar5->field_0).w * (paVar5->field_0).w + (paVar5->field_0).z * (paVar5->field_0).z +
          (paVar5->field_0).y * (paVar5->field_0).y + (paVar5->field_0).x * (paVar5->field_0).x;
  if (fVar9 < 0.0) {
    sqrtf(fVar9);
  }
  uVar8 = CONCAT44(fVar14 - (this->super_Obj).position.field_0.field_0.y,
                   fVar10 - (this->super_Obj).position.field_0.field_0.x);
  uVar7 = CONCAT44(fVar15 - (this->super_Obj).position.field_0.field_0.w,
                   fVar1 - (this->super_Obj).position.field_0.field_0.z);
  left_01.field_0._8_8_ = uVar7;
  left_01.field_0._0_8_ = uVar8;
  right_00.field_0._8_8_ = uVar7;
  right_00.field_0._0_8_ = uVar8;
  dVar11 = Obj::dot(left_01,right_00);
  right_01.field_0._8_8_ = uVar7;
  right_01.field_0._0_8_ = uVar8;
  dVar12 = Obj::dot((vec4)left,right_01);
  fVar10 = (float)(dVar12 + dVar12);
  dVar12 = this->radius;
  dVar13 = Obj::dot((vec4)left_00,(vec4)right);
  fVar14 = fVar10 * fVar10 + (float)dVar13 * -4.0 * (float)((double)(float)dVar11 - dVar12 * dVar12)
  ;
  if (0.0 <= fVar14) {
    fVar15 = ((fVar14 + fVar10) * -0.5) / (float)dVar13;
    pvVar4 = Ray::getDirection((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    fVar10 = (pvVar4->field_0).field_0.x;
    fVar14 = (pvVar4->field_0).field_0.y;
    fVar1 = (pvVar4->field_0).field_0.z;
    pvVar4 = Ray::getOrigin((ray->super___shared_ptr<Ray,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    if (0.0 < fVar15) {
      fVar9 = (pvVar4->field_0).field_0.x;
      fVar2 = (pvVar4->field_0).field_0.y;
      fVar3 = (pvVar4->field_0).field_0.z;
      pvVar6 = (vec3 *)operator_new(0xc);
      (pvVar6->field_0).field_0.x = fVar10 * fVar15 + fVar9;
      (pvVar6->field_0).field_0.y = fVar14 * fVar15 + fVar2;
      (pvVar6->field_0).field_0.z = fVar1 * fVar15 + fVar3;
      return pvVar6;
    }
  }
  return (vec3 *)0x0;
}

Assistant:

glm::vec3* Sphere::intersect(std::shared_ptr<Ray> ray) {

    glm::vec4 origin = ray->getOrigin();
    glm::vec4 direction = ray->getDirection();

    glm::normalize(direction);
    glm::vec4 op = origin - position;
    float dotOp = dot(op,op);


    float b = 2.f * (dot(direction, op));
    float c = dotOp - radius * radius;

    float a = dot(direction, direction);

    float discriminant = b * b - 4  *  a * c ;
    if(discriminant < 0){
        return nullptr;
        }

    double t = (-0.5f) * (b + discriminant) / a;

    glm::vec3 d = glm::vec3 (ray->getDirection());
    glm::vec3 o= glm::vec3 (ray->getOrigin());
    if (t > 0.0f) {
        glm::vec3* hitpoint =  new glm::vec3(o.x + d.x * t, o.y + d.y * t, o.z + d.z * t);
        return hitpoint;
    }
    else
    return nullptr;

}